

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Optional<Catch::ColourMode> Catch::Detail::stringToColourMode(StringRef colourMode)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar2;
  Optional<Catch::ColourMode> *this;
  Optional<Catch::ColourMode> OVar3;
  ColourMode local_79;
  StringRef local_78;
  ColourMode local_61;
  StringRef local_60;
  ColourMode local_49;
  StringRef local_48;
  ColourMode local_31;
  StringRef local_30;
  undefined1 local_20 [8];
  StringRef colourMode_local;
  
  local_20 = (undefined1  [8])colourMode.m_size;
  this = (Optional<Catch::ColourMode> *)colourMode.m_start;
  colourMode_local.m_size = (size_type)this;
  StringRef::StringRef(&local_30,"default");
  bVar1 = StringRef::operator==((StringRef *)local_20,local_30);
  if (bVar1) {
    local_31 = PlatformDefault;
    Optional<Catch::ColourMode>::Optional(this,&local_31);
    uVar2 = extraout_RDX;
  }
  else {
    StringRef::StringRef(&local_48,"ansi");
    bVar1 = StringRef::operator==((StringRef *)local_20,local_48);
    if (bVar1) {
      local_49 = ANSI;
      Optional<Catch::ColourMode>::Optional(this,&local_49);
      uVar2 = extraout_RDX_00;
    }
    else {
      StringRef::StringRef(&local_60,"win32");
      bVar1 = StringRef::operator==((StringRef *)local_20,local_60);
      if (bVar1) {
        local_61 = Win32;
        Optional<Catch::ColourMode>::Optional(this,&local_61);
        uVar2 = extraout_RDX_01;
      }
      else {
        StringRef::StringRef(&local_78,"none");
        bVar1 = StringRef::operator==((StringRef *)local_20,local_78);
        if (bVar1) {
          local_79 = None;
          Optional<Catch::ColourMode>::Optional(this,&local_79);
          uVar2 = extraout_RDX_02;
        }
        else {
          Optional<Catch::ColourMode>::Optional(this);
          uVar2 = extraout_RDX_03;
        }
      }
    }
  }
  OVar3._8_8_ = uVar2;
  OVar3.nullableValue = (ColourMode *)this;
  return OVar3;
}

Assistant:

Optional<ColourMode> stringToColourMode( StringRef colourMode ) {
            if ( colourMode == "default" ) {
                return ColourMode::PlatformDefault;
            } else if ( colourMode == "ansi" ) {
                return ColourMode::ANSI;
            } else if ( colourMode == "win32" ) {
                return ColourMode::Win32;
            } else if ( colourMode == "none" ) {
                return ColourMode::None;
            } else {
                return {};
            }
        }